

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
          (internal *this,char *expected_expression,char *actual_expression,
          SquareMatrix<3> *expected,SquareMatrix<3> *actual)

{
  float fVar1;
  float fVar2;
  Float (*paFVar3) [3];
  Float (*value) [3];
  SquareMatrix<3> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  AssertionResult AVar8;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  uVar5 = 0;
  bVar7 = false;
  paFVar3 = (Float (*) [3])expected;
  value = (Float (*) [3])actual;
  do {
    lVar6 = 0;
    do {
      fVar1 = (*(Float (*) [3])*paFVar3)[lVar6];
      fVar2 = (*(Float (*) [3])*value)[lVar6];
      if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
        if (bVar7) goto LAB_002c564e;
        PrintToString<pbrt::SquareMatrix<3>>(&local_40,(testing *)expected,(SquareMatrix<3> *)value)
        ;
        PrintToString<pbrt::SquareMatrix<3>>(&local_60,(testing *)actual,value_00);
        AVar8 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
        sVar4 = AVar8.message_.ptr_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          sVar4.ptr_ = extraout_RDX;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          sVar4.ptr_ = extraout_RDX_00;
        }
        goto LAB_002c56c3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    bVar7 = 1 < uVar5;
    uVar5 = uVar5 + 1;
    value = value + 1;
    paFVar3 = paFVar3 + 1;
    if (uVar5 == 3) {
LAB_002c564e:
      AVar8 = AssertionSuccess();
      sVar4 = AVar8.message_.ptr_;
LAB_002c56c3:
      AVar8.message_.ptr_ = sVar4.ptr_;
      AVar8._0_8_ = this;
      return AVar8;
    }
  } while( true );
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}